

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O2

void hexToDigit(uint *val,uchar *hex)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  
  uVar2 = *val;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    bVar1 = hex[lVar3];
    bVar4 = (bVar1 & 0xdf) - 7;
    if (bVar1 < 0x41) {
      bVar4 = bVar1;
    }
    uVar2 = uVar2 << 4 | (uint)(byte)(bVar4 - 0x30);
    *val = uVar2;
  }
  return;
}

Assistant:

static void hexToDigit(unsigned int * val, const unsigned char * hex)
{
    unsigned int i;
    for (i=0;i<4;i++) {
        unsigned char c = hex[i];
        if (c >= 'A') c = (c & ~0x20) - 7;
        c -= '0';
        assert(!(c & 0xF0));
        *val = (*val << 4) | c;
    }
}